

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u64 filterHash(Mem *aMem,Op *pOp)

{
  ushort uVar1;
  long lVar2;
  Mem *pMem;
  long lVar3;
  u64 uVar4;
  long lVar5;
  
  lVar5 = (long)pOp->p3;
  lVar3 = (pOp->p4).i + lVar5;
  pMem = aMem + lVar5;
  uVar4 = 0;
  do {
    if (lVar3 <= lVar5) {
      return uVar4;
    }
    uVar1 = pMem->flags;
    if ((uVar1 & 0x24) == 0) {
      if ((uVar1 & 8) == 0) {
        if (((uVar1 & 0x12) == 0) || (uVar4 = uVar4 + (long)pMem->n, (uVar1 >> 10 & 1) == 0))
        goto LAB_0013e59c;
        lVar2 = (long)(pMem->u).nZero;
      }
      else {
        lVar2 = sqlite3VdbeIntValue(pMem);
      }
      uVar4 = uVar4 + lVar2;
    }
    else {
      uVar4 = uVar4 + (long)(pMem->u).zPType;
    }
LAB_0013e59c:
    lVar5 = lVar5 + 1;
    pMem = pMem + 1;
  } while( true );
}

Assistant:

static u64 filterHash(const Mem *aMem, const Op *pOp){
  int i, mx;
  u64 h = 0;

  assert( pOp->p4type==P4_INT32 );
  for(i=pOp->p3, mx=i+pOp->p4.i; i<mx; i++){
    const Mem *p = &aMem[i];
    if( p->flags & (MEM_Int|MEM_IntReal) ){
      h += p->u.i;
    }else if( p->flags & MEM_Real ){
      h += sqlite3VdbeIntValue(p);
    }else if( p->flags & (MEM_Str|MEM_Blob) ){
      h += p->n;
      if( p->flags & MEM_Zero ) h += p->u.nZero;
    }
  }
  return h;
}